

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O0

void hmm_clear_scores(hmm_t *h)

{
  int local_14;
  int32 i;
  hmm_t *h_local;
  
  h->state[0].score = -0x38000000;
  for (local_14 = 1; local_14 < (int)(uint)h->n_emit_state; local_14 = local_14 + 1) {
    h->state[local_14].score = -0x38000000;
  }
  (h->out).score = -0x38000000;
  h->bestscore = -0x38000000;
  return;
}

Assistant:

void
hmm_clear_scores(hmm_t * h)
{
    int32 i;

    hmm_in_score(h) = WORST_SCORE;
    for (i = 1; i < hmm_n_emit_state(h); i++)
        hmm_score(h, i) = WORST_SCORE;
    hmm_out_score(h) = WORST_SCORE;

    h->bestscore = WORST_SCORE;
}